

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::analyze_instructions(Impl *this,Function *func)

{
  BasicBlock *pBVar1;
  bool bVar2;
  int iVar3;
  LoadInst *inst_00;
  PHINode *inst_01;
  StoreInst *inst_02;
  AtomicRMWInst *inst_03;
  AtomicCmpXchgInst *inst_04;
  AllocaInst *inst_05;
  GetElementPtrInst *inst_06;
  ExtractValueInst *inst_07;
  CmpInst *inst_08;
  reference ppBVar4;
  Instruction *pIVar5;
  CallInst *pCVar6;
  Function *pFVar7;
  String *pSVar8;
  char *pcVar9;
  reference ppVar10;
  Type *pTVar11;
  Type *scalar_type;
  pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking> *alloc;
  iterator __end1_2;
  iterator __begin1_2;
  UnorderedMap<const_LLVMBC::AllocaInst_*,_AllocaCBVForwardingTracking> *__range1_2;
  Function *called_function_1;
  CallInst *call_inst_1;
  Instruction *inst_1;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  __end2_1;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  __begin2_1;
  BasicBlock *__range2_1;
  BasicBlock *bb_1;
  iterator __end1_1;
  iterator __begin1_1;
  Vector<LLVMBC::BasicBlock_*> *__range1_1;
  Function *called_function;
  CallInst *call_inst;
  CmpInst *cmp_inst;
  ExtractValueInst *extractvalue_inst;
  GetElementPtrInst *getelementptr_inst;
  AllocaInst *alloca_inst;
  AtomicCmpXchgInst *cmpxchg_inst;
  AtomicRMWInst *atomicrmw_inst;
  StoreInst *store_inst;
  PHINode *phi_inst;
  LoadInst *load_inst;
  Instruction *inst;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  __end2;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  __begin2;
  BasicBlock *__range2;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  Vector<LLVMBC::BasicBlock_*> *__range1;
  Vector<LLVMBC::BasicBlock_*> visit_order;
  Function *func_local;
  Impl *this_local;
  
  visit_order.
  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  if (((func != (Function *)0x0) && (((this->options).propagate_precise & 1U) != 0)) &&
     (((this->options).force_precise & 1U) == 0)) {
    propagate_precise(func);
  }
  build_function_bb_visit_order_analysis
            ((Vector<LLVMBC::BasicBlock_*> *)&__range1,this,
             (Function *)
             visit_order.
             super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __end1 = std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
           ::begin((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                    *)&__range1);
  bb = (BasicBlock *)
       std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::end
                 ((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                   *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
                                     *)&bb), bVar2) {
    ppBVar4 = __gnu_cxx::
              __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
              ::operator*(&__end1);
    pBVar1 = *ppBVar4;
    if (((this->options).eliminate_dead_code & 1U) != 0) {
      pIVar5 = LLVMBC::BasicBlock::getTerminator(pBVar1);
      mark_used_values(this,pIVar5);
    }
    __end2 = LLVMBC::BasicBlock::begin(pBVar1);
    inst = (Instruction *)LLVMBC::BasicBlock::end(pBVar1);
    while (bVar2 = LLVMBC::
                   IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
                   ::operator!=(&__end2,(IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
                                         *)&inst), bVar2) {
      pIVar5 = LLVMBC::
               IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
               ::operator*(&__end2);
      if (((this->options).eliminate_dead_code & 1U) != 0) {
        mark_used_values(this,pIVar5);
      }
      inst_00 = LLVMBC::dyn_cast<LLVMBC::LoadInst>(&pIVar5->super_Value);
      if (inst_00 == (LoadInst *)0x0) {
        inst_01 = LLVMBC::dyn_cast<LLVMBC::PHINode>(&pIVar5->super_Value);
        if (inst_01 == (PHINode *)0x0) {
          inst_02 = LLVMBC::dyn_cast<LLVMBC::StoreInst>(&pIVar5->super_Value);
          if (inst_02 == (StoreInst *)0x0) {
            inst_03 = LLVMBC::dyn_cast<LLVMBC::AtomicRMWInst>(&pIVar5->super_Value);
            if (inst_03 == (AtomicRMWInst *)0x0) {
              inst_04 = LLVMBC::dyn_cast<LLVMBC::AtomicCmpXchgInst>(&pIVar5->super_Value);
              if (inst_04 == (AtomicCmpXchgInst *)0x0) {
                inst_05 = LLVMBC::dyn_cast<LLVMBC::AllocaInst>(&pIVar5->super_Value);
                if (inst_05 == (AllocaInst *)0x0) {
                  inst_06 = LLVMBC::dyn_cast<LLVMBC::GetElementPtrInst>(&pIVar5->super_Value);
                  if (inst_06 == (GetElementPtrInst *)0x0) {
                    inst_07 = LLVMBC::dyn_cast<LLVMBC::ExtractValueInst>(&pIVar5->super_Value);
                    if (inst_07 == (ExtractValueInst *)0x0) {
                      inst_08 = LLVMBC::dyn_cast<LLVMBC::CmpInst>(&pIVar5->super_Value);
                      if (inst_08 == (CmpInst *)0x0) {
                        pCVar6 = LLVMBC::dyn_cast<LLVMBC::CallInst>(&pIVar5->super_Value);
                        if (pCVar6 != (CallInst *)0x0) {
                          pFVar7 = LLVMBC::CallInst::getCalledFunction(pCVar6);
                          pSVar8 = LLVMBC::Function::getName_abi_cxx11_(pFVar7);
                          pcVar9 = std::__cxx11::
                                   basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                   ::data(pSVar8);
                          iVar3 = strncmp(pcVar9,"dx.op",5);
                          if ((iVar3 == 0) &&
                             (bVar2 = analyze_dxil_instruction(this,pCVar6,pBVar1), !bVar2)) {
                            this_local._7_1_ = false;
                            goto LAB_0014f6c5;
                          }
                        }
                      }
                      else {
                        bVar2 = analyze_compare_instruction(this,inst_08);
                        if (!bVar2) {
                          this_local._7_1_ = false;
                          goto LAB_0014f6c5;
                        }
                      }
                    }
                    else {
                      bVar2 = analyze_extractvalue_instruction(this,inst_07);
                      if (!bVar2) {
                        this_local._7_1_ = false;
                        goto LAB_0014f6c5;
                      }
                    }
                  }
                  else {
                    bVar2 = analyze_getelementptr_instruction(this,inst_06);
                    if (!bVar2) {
                      this_local._7_1_ = false;
                      goto LAB_0014f6c5;
                    }
                  }
                }
                else {
                  bVar2 = analyze_alloca_instruction(this,inst_05);
                  if (!bVar2) {
                    this_local._7_1_ = false;
                    goto LAB_0014f6c5;
                  }
                }
              }
              else {
                bVar2 = analyze_cmpxchg_instruction(this,inst_04);
                if (!bVar2) {
                  this_local._7_1_ = false;
                  goto LAB_0014f6c5;
                }
              }
            }
            else {
              bVar2 = analyze_atomicrmw_instruction(this,inst_03);
              if (!bVar2) {
                this_local._7_1_ = false;
                goto LAB_0014f6c5;
              }
            }
          }
          else {
            bVar2 = analyze_store_instruction(this,inst_02);
            if (!bVar2) {
              this_local._7_1_ = false;
              goto LAB_0014f6c5;
            }
          }
        }
        else {
          bVar2 = analyze_phi_instruction(this,inst_01);
          if (!bVar2) {
            this_local._7_1_ = false;
            goto LAB_0014f6c5;
          }
        }
      }
      else {
        bVar2 = analyze_load_instruction(this,inst_00);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_0014f6c5;
        }
      }
      LLVMBC::
      IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
      ::operator++(&__end2);
    }
    anon_struct_528_14_18f0960e_for_ags::reset(&this->ags);
    __gnu_cxx::
    __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
             begin((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                    *)&__range1);
  bb_1 = (BasicBlock *)
         std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
         end((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_> *)
             &__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
                             *)&bb_1), bVar2) {
    ppBVar4 = __gnu_cxx::
              __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
              ::operator*(&__end1_1);
    pBVar1 = *ppBVar4;
    __end2_1 = LLVMBC::BasicBlock::begin(pBVar1);
    inst_1 = (Instruction *)LLVMBC::BasicBlock::end(pBVar1);
    while (bVar2 = LLVMBC::
                   IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
                   ::operator!=(&__end2_1,
                                (IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
                                 *)&inst_1), bVar2) {
      pIVar5 = LLVMBC::
               IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
               ::operator*(&__end2_1);
      pCVar6 = LLVMBC::dyn_cast<LLVMBC::CallInst>(&pIVar5->super_Value);
      if (pCVar6 != (CallInst *)0x0) {
        pFVar7 = LLVMBC::CallInst::getCalledFunction(pCVar6);
        pSVar8 = LLVMBC::Function::getName_abi_cxx11_(pFVar7);
        pcVar9 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                 data(pSVar8);
        iVar3 = strncmp(pcVar9,"dx.op",5);
        if ((iVar3 == 0) && (bVar2 = analyze_dxil_buffer_access_instruction(this,pCVar6), !bVar2)) {
          this_local._7_1_ = false;
          goto LAB_0014f6c5;
        }
      }
      LLVMBC::
      IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
      ::operator++(&__end2_1);
    }
    anon_struct_528_14_18f0960e_for_ags::reset(&this->ags);
    __gnu_cxx::
    __normal_iterator<LLVMBC::BasicBlock_**,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             unordered_map<const_LLVMBC::AllocaInst_*,_dxil_spv::AllocaCBVForwardingTracking,_std::hash<const_LLVMBC::AllocaInst_*>,_std::equal_to<const_LLVMBC::AllocaInst_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>_>
             ::begin(&this->alloca_tracking);
  alloc = (pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking> *)
          std::
          unordered_map<const_LLVMBC::AllocaInst_*,_dxil_spv::AllocaCBVForwardingTracking,_std::hash<const_LLVMBC::AllocaInst_*>,_std::equal_to<const_LLVMBC::AllocaInst_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>_>
          ::end(&this->alloca_tracking);
  do {
    bVar2 = std::__detail::operator!=
                      (&__end1_2.
                        super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
                       ,(_Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
                         *)&alloc);
    if (!bVar2) {
      anon_struct_528_14_18f0960e_for_ags::reset_analysis(&this->ags);
      this_local._7_1_ = true;
LAB_0014f6c5:
      std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
      ~vector((vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_> *
              )&__range1);
      return this_local._7_1_;
    }
    ppVar10 = std::__detail::
              _Node_iterator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false,_false>
              ::operator*(&__end1_2);
    pTVar11 = LLVMBC::Value::getType((Value *)ppVar10->first);
    pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
    pTVar11 = LLVMBC::Type::getArrayElementType(pTVar11);
    bVar2 = analyze_alloca_cbv_forwarding_pre_resource_emit(this,pTVar11,&ppVar10->second);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0014f6c5;
    }
    std::__detail::
    _Node_iterator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false,_false>
    ::operator++(&__end1_2);
  } while( true );
}

Assistant:

bool Converter::Impl::analyze_instructions(llvm::Function *func)
{
	// Need to analyze this in two stages.
	// In the first stage, we need to analyze:
	// - Load/GetElementPtr to handle lib global variables
	// - CreateHandle family to build LLVM access handles
	// - ExtractValue to track which components are used for BufferLoad.
	// In the second phase we analyze the buffer loads and stores and figure out
	// alignments of the loads and stores. This lets us build up a list of SSBO declarations we need to
	// optimally implement the loads and stores. We need to do this late, because we depend on results
	// of ExtractValue analysis.

	if (func && options.propagate_precise && !options.force_precise)
		propagate_precise(func);

	auto visit_order = build_function_bb_visit_order_analysis(func);

	for (auto *bb : visit_order)
	{
		if (options.eliminate_dead_code)
			mark_used_values(bb->getTerminator());

		for (auto &inst : *bb)
		{
			if (options.eliminate_dead_code)
				mark_used_values(&inst);

			if (auto *load_inst = llvm::dyn_cast<llvm::LoadInst>(&inst))
			{
				if (!analyze_load_instruction(*this, load_inst))
					return false;
			}
			else if (auto *phi_inst = llvm::dyn_cast<llvm::PHINode>(&inst))
			{
				if (!analyze_phi_instruction(*this, phi_inst))
					return false;
			}
			else if (auto *store_inst = llvm::dyn_cast<llvm::StoreInst>(&inst))
			{
				if (!analyze_store_instruction(*this, store_inst))
					return false;
			}
			else if (auto *atomicrmw_inst = llvm::dyn_cast<llvm::AtomicRMWInst>(&inst))
			{
				if (!analyze_atomicrmw_instruction(*this, atomicrmw_inst))
					return false;
			}
			else if (auto *cmpxchg_inst = llvm::dyn_cast<llvm::AtomicCmpXchgInst>(&inst))
			{
				if (!analyze_cmpxchg_instruction(*this, cmpxchg_inst))
					return false;
			}
			else if (auto *alloca_inst = llvm::dyn_cast<llvm::AllocaInst>(&inst))
			{
				if (!analyze_alloca_instruction(*this, alloca_inst))
					return false;
			}
			else if (auto *getelementptr_inst = llvm::dyn_cast<llvm::GetElementPtrInst>(&inst))
			{
				if (!analyze_getelementptr_instruction(*this, getelementptr_inst))
					return false;
			}
			else if (auto *extractvalue_inst = llvm::dyn_cast<llvm::ExtractValueInst>(&inst))
			{
				if (!analyze_extractvalue_instruction(*this, extractvalue_inst))
					return false;
			}
			else if (auto *cmp_inst = llvm::dyn_cast<llvm::CmpInst>(&inst))
			{
				if (!analyze_compare_instruction(*this, cmp_inst))
					return false;
			}
			else if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&inst))
			{
				auto *called_function = call_inst->getCalledFunction();
				if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
				{
					if (!analyze_dxil_instruction(*this, call_inst, bb))
						return false;
				}
			}
		}

		// Reset AGS tracking for every BB.
		ags.reset();
	}

	for (auto *bb : visit_order)
	{
		for (auto &inst : *bb)
		{
			if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&inst))
			{
				auto *called_function = call_inst->getCalledFunction();
				if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
				{
					if (!analyze_dxil_buffer_access_instruction(*this, call_inst))
						return false;
				}
			}
		}

		// Reset AGS tracking for every BB.
		ags.reset();
	}

	for (auto &alloc : alloca_tracking)
	{
		// Mark required resource aliases before we emit resources. Defer some work until after resource creation.
		const auto *scalar_type =
		    alloc.first->getType()->getPointerElementType()->getArrayElementType();
		if (!analyze_alloca_cbv_forwarding_pre_resource_emit(*this, scalar_type, alloc.second))
			return false;
	}

	ags.reset_analysis();

	return true;
}